

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magnet_uri.cpp
# Opt level: O2

add_torrent_params *
libtorrent::parse_magnet_uri(add_torrent_params *__return_storage_ptr__,string_view uri)

{
  error_code *in_R8;
  string_view uri_00;
  error_code ec;
  undefined1 local_30 [4];
  bool local_2c;
  system_error_category *local_28;
  
  local_30 = (undefined1  [4])0x0;
  local_2c = false;
  local_28 = &boost::system::detail::cat_holder<void>::system_category_instance;
  add_torrent_params::add_torrent_params(__return_storage_ptr__);
  uri_00._M_str = (char *)__return_storage_ptr__;
  uri_00._M_len = (size_t)uri._M_str;
  parse_magnet_uri((libtorrent *)uri._M_len,uri_00,(add_torrent_params *)local_30,in_R8);
  if (local_2c != true) {
    return __return_storage_ptr__;
  }
  aux::throw_ex<boost::system::system_error,boost::system::error_code&>((error_code *)local_30);
}

Assistant:

add_torrent_params parse_magnet_uri(string_view uri)
	{
		error_code ec;
		add_torrent_params ret;
		parse_magnet_uri(uri, ret, ec);
		if (ec) aux::throw_ex<system_error>(ec);
		return ret;
	}